

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

int __thiscall CTcUnasSrcCodeBody::next_byte(CTcUnasSrcCodeBody *this,char *ch)

{
  char cVar1;
  char *in_RSI;
  CTcDataStream *in_RDI;
  bool bVar2;
  ulong in_stack_ffffffffffffffd8;
  uint local_4;
  
  bVar2 = in_RDI->wp_ <= (char *)in_RDI->obj_file_start_ofs_;
  if (!bVar2) {
    cVar1 = CTcDataStream::get_byte_at(in_RDI,in_stack_ffffffffffffffd8);
    *in_RSI = cVar1;
    in_RDI->obj_file_start_ofs_ = in_RDI->obj_file_start_ofs_ + 1;
  }
  local_4 = (uint)bVar2;
  return local_4;
}

Assistant:

int next_byte(char *ch)
    {
        /* if there's anything left, return it */
        if (cur_ofs_ < end_ofs_)
        {
            /* return the next byte */
            *ch = str_->get_byte_at(cur_ofs_);
            ++cur_ofs_;
            return 0;
        }
        else
        {
            /* indicate end of file */
            return 1;
        }
    }